

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

char tag_options_item(menu_conflict *menu,wchar_t oid)

{
  ulong uVar1;
  
  if ((uint)oid < 0xf) {
    return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[oid];
  }
  if ((oid != L'\x0f') && (uVar1 = (long)oid - 0x10, uVar1 < 3)) {
    return extra_item_options[uVar1].tag;
  }
  return '\0';
}

Assistant:

static char tag_options_item(struct menu *menu, int oid)
{
	size_t line = (size_t) oid;

	if (line < N_ELEMENTS(sval_dependent))
		return all_letters_nohjkl[oid];

	/* Separator - blank line. */
	if (line == N_ELEMENTS(sval_dependent))
		return 0;

	line = line - N_ELEMENTS(sval_dependent) - 1;

	if (line < N_ELEMENTS(extra_item_options))
		return extra_item_options[line].tag;

	return 0;
}